

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall rcg::System::getNodeMap(System *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar2;
  lock_guard<std::recursive_mutex> lock;
  char *in_stack_00000d20;
  CPort *in_stack_00000d28;
  void *in_stack_00000d30;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000d38;
  CPort *in_stack_ffffffffffffff48;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff50;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffff58;
  CPort *in_stack_ffffffffffffff60;
  CPort local_28;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff50,
             (mutex_type *)in_stack_ffffffffffffff48);
  if (*(long *)(in_RSI + 0x70) != 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x88));
    if (!bVar1) {
      operator_new(0x20);
      std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff50,
                 (shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff48);
      CPort::CPort(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   &in_stack_ffffffffffffff50->_M_ptr);
      std::shared_ptr<rcg::CPort>::shared_ptr<rcg::CPort,void>
                ((shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 =
           (__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x78);
      in_stack_ffffffffffffff48 = &local_28;
      std::shared_ptr<rcg::CPort>::operator=
                ((shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff50,
                 (shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff48);
      std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x13d3f4);
      std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)0x13d3fe);
      std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff50,
                 (shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff48);
      std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::get(in_stack_ffffffffffffff50);
      allocNodeMap(in_stack_00000d38,in_stack_00000d30,in_stack_00000d28,in_stack_00000d20);
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff50,
                 (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff48);
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x13d46c);
      std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)0x13d476);
    }
  }
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff50,
             (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff48);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x13d507);
  sVar2.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<GenApi_3_4::CNodeMapRef>)
         sVar2.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> System::getNodeMap()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  if (tl != 0 && !nodemap)
  {
    cport=std::shared_ptr<CPort>(new CPort(gentl, &tl));
    nodemap=allocNodeMap(gentl, tl, cport.get());
  }

  return nodemap;
}